

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5PoslistFilterCallback(Fts5Index *pUnused,void *pContext,u8 *pChunk,int nChunk)

{
  u8 uVar1;
  uint uVar2;
  u8 *puVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  int iCol_1;
  int iCol;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  if (0 < nChunk) {
    local_38 = 0;
    uVar8 = 0;
    if (*(int *)((long)pContext + 0x10) == 2) {
      local_3c = (uint)*pChunk;
      uVar8 = 1;
      if ((char)*pChunk < '\0') {
        uVar2 = sqlite3Fts5GetVarint32(pChunk,&local_3c);
        uVar8 = (ulong)uVar2;
      }
      lVar5 = (long)**(int **)((long)pContext + 8);
      if (0 < lVar5) {
        lVar6 = 0;
        do {
          if ((*(int **)((long)pContext + 8))[lVar6 + 1] == local_3c) {
            *(undefined4 *)((long)pContext + 0x10) = 1;
            *(undefined1 *)(**pContext + (long)(int)(*pContext)[1]) = 1;
            *(int *)(*pContext + 8) = *(int *)(*pContext + 8) + 1;
            goto LAB_001a7130;
          }
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
      }
      *(undefined4 *)((long)pContext + 0x10) = 0;
    }
LAB_001a7130:
    do {
      if ((int)uVar8 < nChunk) {
        do {
          bVar10 = pChunk[(int)uVar8] == '\x01';
          if (bVar10) {
            bVar10 = true;
            uVar9 = uVar8;
            break;
          }
          puVar3 = pChunk + (int)uVar8;
          do {
            uVar2 = (int)uVar8 + 1;
            uVar8 = (ulong)uVar2;
            uVar1 = *puVar3;
            puVar3 = puVar3 + 1;
          } while ((char)uVar1 < '\0');
          uVar9 = uVar8;
        } while ((int)uVar2 < nChunk);
      }
      else {
        bVar10 = false;
        uVar9 = uVar8;
      }
      iVar7 = (int)uVar9;
      if (*(int *)((long)pContext + 0x10) != 0) {
        iVar4 = iVar7 - (int)local_38;
        memcpy((void *)((long)(int)(*pContext)[1] + **pContext),pChunk + (int)local_38,(long)iVar4);
        *(int *)(*pContext + 8) = *(int *)(*pContext + 8) + iVar4;
      }
      uVar8 = uVar9;
      if (bVar10) {
        uVar8 = (long)iVar7 + 1;
        if ((int)uVar8 < nChunk) {
          local_40 = (uint)pChunk[uVar8];
          if ((char)pChunk[uVar8] < '\0') {
            iVar4 = sqlite3Fts5GetVarint32(pChunk + uVar8,&local_40);
            uVar2 = iVar4 + (int)uVar8;
          }
          else {
            uVar2 = iVar7 + 2;
          }
          uVar8 = (ulong)uVar2;
          lVar5 = (long)**(int **)((long)pContext + 8);
          if (0 < lVar5) {
            lVar6 = 0;
            do {
              if ((*(int **)((long)pContext + 8))[lVar6 + 1] == local_40) {
                *(undefined4 *)((long)pContext + 0x10) = 1;
                memcpy((void *)((long)(int)(*pContext)[1] + **pContext),pChunk + iVar7,
                       (long)(int)(uVar2 - iVar7));
                *(int *)(*pContext + 8) = *(int *)(*pContext + 8) + (uVar2 - iVar7);
                uVar9 = uVar8;
                goto LAB_001a7237;
              }
              lVar6 = lVar6 + 1;
            } while (lVar5 != lVar6);
          }
          *(undefined4 *)((long)pContext + 0x10) = 0;
        }
        else {
          *(undefined4 *)((long)pContext + 0x10) = 2;
        }
LAB_001a7237:
        uVar8 = uVar8 & 0xffffffff;
        local_38 = uVar9;
      }
    } while ((int)uVar8 < nChunk);
  }
  return;
}

Assistant:

static void fts5PoslistFilterCallback(
  Fts5Index *pUnused,
  void *pContext, 
  const u8 *pChunk, int nChunk
){
  PoslistCallbackCtx *pCtx = (PoslistCallbackCtx*)pContext;
  UNUSED_PARAM(pUnused);
  assert_nc( nChunk>=0 );
  if( nChunk>0 ){
    /* Search through to find the first varint with value 1. This is the
    ** start of the next columns hits. */
    int i = 0;
    int iStart = 0;

    if( pCtx->eState==2 ){
      int iCol;
      fts5FastGetVarint32(pChunk, i, iCol);
      if( fts5IndexColsetTest(pCtx->pColset, iCol) ){
        pCtx->eState = 1;
        fts5BufferSafeAppendVarint(pCtx->pBuf, 1);
      }else{
        pCtx->eState = 0;
      }
    }

    do {
      while( i<nChunk && pChunk[i]!=0x01 ){
        while( pChunk[i] & 0x80 ) i++;
        i++;
      }
      if( pCtx->eState ){
        fts5BufferSafeAppendBlob(pCtx->pBuf, &pChunk[iStart], i-iStart);
      }
      if( i<nChunk ){
        int iCol;
        iStart = i;
        i++;
        if( i>=nChunk ){
          pCtx->eState = 2;
        }else{
          fts5FastGetVarint32(pChunk, i, iCol);
          pCtx->eState = fts5IndexColsetTest(pCtx->pColset, iCol);
          if( pCtx->eState ){
            fts5BufferSafeAppendBlob(pCtx->pBuf, &pChunk[iStart], i-iStart);
            iStart = i;
          }
        }
      }
    }while( i<nChunk );
  }
}